

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::paintEvent(QTreeView *this,QPaintEvent *event)

{
  QTreeViewPrivate *this_00;
  QWidget *pQVar1;
  QPaintDevice *pQVar2;
  long in_FS_OFFSET;
  QPainter painter;
  QRect local_58;
  QRegion local_48;
  QRegion local_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  pQVar2 = &pQVar1->super_QPaintDevice;
  if (pQVar1 == (QWidget *)0x0) {
    pQVar2 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter((QPainter *)&local_38,pQVar2);
  if ((this_00->super_QAbstractItemViewPrivate).state == AnimatingState) {
    local_58 = QTreeViewPrivate::AnimatedOperation::rect(&this_00->animatedOperation);
    QRegion::QRegion(&local_48,&local_58,Rectangle);
    QRegion::operator-(&local_40,(QRegion *)(event + 0x20));
    drawTree(this,(QPainter *)&local_38,&local_40);
    QRegion::~QRegion(&local_40);
    QRegion::~QRegion(&local_48);
    QTreeViewPrivate::drawAnimatedOperation(this_00,(QPainter *)&local_38);
  }
  else {
    drawTree(this,(QPainter *)&local_38,(QRegion *)(event + 0x20));
    QAbstractItemViewPrivate::paintDropIndicator
              (&this_00->super_QAbstractItemViewPrivate,(QPainter *)&local_38);
  }
  QPainter::~QPainter((QPainter *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::paintEvent(QPaintEvent *event)
{
    Q_D(QTreeView);
    d->executePostedLayout();
    QPainter painter(viewport());
#if QT_CONFIG(animation)
    if (d->isAnimating()) {
        drawTree(&painter, event->region() - d->animatedOperation.rect());
        d->drawAnimatedOperation(&painter);
    } else
#endif // animation
    {
        drawTree(&painter, event->region());
#if QT_CONFIG(draganddrop)
        d->paintDropIndicator(&painter);
#endif
    }
}